

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ImportModuleTypes(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  SmallArray<TypeBase_*,_32U> *this;
  ModuleData **ppMVar1;
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this_00;
  uint alignment;
  uint uniqueId;
  ByteCode *code;
  ModuleData *pMVar2;
  Lexeme *pLVar3;
  Allocator *allocator;
  ScopeData *scope;
  _func_int **pp_Var4;
  IntrusiveList<MatchData> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  DelayedType *pDVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  ExternTypeInfo *pEVar12;
  ModuleData **ppMVar13;
  TypeBase **ppTVar14;
  SynIdentifier *pSVar15;
  TypeHandle *pTVar16;
  MatchData *pMVar17;
  TypeClass *baseClass;
  SynBase *this_01;
  ParseContext *this_02;
  SynClassDefinition *definition;
  undefined4 extraout_var_04;
  TypeGenericClassProto *proto;
  TypeClass *this_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TypeBase *pTVar18;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  MemberHandle *pMVar20;
  size_t sVar21;
  undefined4 extraout_var_11;
  TypeBase *pTVar22;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar23;
  undefined4 extraout_var_14;
  ExprBase *pEVar24;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  ConstantData *node;
  undefined4 extraout_var_19;
  TypeBase *pTVar25;
  undefined4 extraout_var_20;
  uint uVar26;
  long lVar27;
  ExternTypeInfo *pEVar28;
  TypeRef *__s;
  char *pcVar29;
  char *pcVar30;
  ExternTypedefInfo *pEVar31;
  ulong uVar32;
  NamespaceData *nameSpace;
  longlong *plVar33;
  InplaceStr typeName;
  TypeClass *forwardDeclaration;
  IntrusiveList<TypeHandle> generics;
  SynIdentifier identifier;
  IntrusiveList<MatchData> actualGenerics;
  TraceScope traceScope;
  SmallArray<DelayedType,_32U> delayedTypes;
  ExternConstantInfo *local_370;
  InplaceStr local_348;
  TypeClass *local_338;
  HashMap<TypeClass_*> *local_330;
  NamespaceData *local_328;
  ExternTypeInfo *local_320;
  ExternTypedefInfo *local_318;
  TypeClass *local_310;
  IntrusiveList<TypeHandle> local_308;
  ExternMemberInfo *local_2f0;
  undefined1 local_2e8 [8];
  MatchData *pMStack_2e0;
  ModuleData *local_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined2 local_2c0;
  undefined6 uStack_2be;
  undefined2 uStack_2b8;
  undefined6 uStack_2b6;
  undefined2 local_2b0;
  char *local_2a8;
  char *pcStack_2a0;
  TypeModulePair local_290;
  IntrusiveList<MatchData> local_278;
  TraceScope local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  SmallArray<DelayedType,_32U> local_248;
  undefined8 *puVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_10;
  undefined4 extraout_var_15;
  undefined4 extraout_var_18;
  
  if ((ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::
                                   token), iVar8 != 0)) {
    ImportModuleTypes::token = NULLC::TraceGetToken("analyze","ImportModuleTypes");
    __cxa_guard_release(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_268,ImportModuleTypes::token);
  code = moduleCtx->data->bytecode;
  pcVar11 = FindSymbols(code);
  pEVar12 = FindFirstType(code);
  local_2f0 = FindFirstMember(code);
  local_370 = FindFirstConstant(code);
  local_318 = FindFirstTypedef(code);
  this = &moduleCtx->types;
  uVar26 = (moduleCtx->types).count;
  uVar10 = code->typeCount;
  if ((moduleCtx->types).max <= uVar10) {
    SmallArray<TypeBase_*,_32U>::grow(this,uVar10);
  }
  ppMVar1 = &moduleCtx->data;
  (moduleCtx->types).count = uVar10;
  memset((moduleCtx->types).data + uVar26,0,(ulong)(uVar10 - uVar26) << 3);
  local_248.allocator = ctx->allocator;
  lVar27 = 0x18;
  do {
    *(undefined4 *)((long)&uStack_250 + lVar27) = 0;
    *(undefined8 *)((long)&((SmallArray<DelayedType,_32U> *)(local_248.little + -1))->data + lVar27)
         = 0;
    lVar27 = lVar27 + 0x10;
  } while (lVar27 != 0x218);
  local_248.data = local_248.little;
  local_248.count = 0;
  local_248.max = 0x20;
  local_320 = pEVar12;
  if (code->typeCount != 0) {
    this_00 = &ctx->internalTypeMap;
    local_330 = &ctx->genericTypeMap;
    uVar32 = 0;
    do {
      ppMVar13 = ppMVar1;
      if (pEVar12[uVar32].definitionModule != 0) {
        uVar26 = pEVar12[uVar32].definitionModule - 1;
        if ((moduleCtx->dependencies).count <= uVar26) {
          pcVar11 = 
          "T &SmallArray<ModuleData *, 32>::operator[](unsigned int) [T = ModuleData *, N = 32]";
          goto LAB_00189492;
        }
        ppMVar13 = (moduleCtx->dependencies).data + uVar26;
      }
      pEVar28 = pEVar12 + uVar32;
      pMVar2 = *ppMVar13;
      if ((pEVar28->typeFlags & 8) == 0) {
LAB_00188180:
        if (CAT_FUNCTION < pEVar28->subCat) {
          if (pEVar28->subCat != CAT_CLASS) {
            pcVar29 = ((*ppMVar1)->name).begin;
            anon_unknown.dwarf_c6b42::Stop
                      (ctx,source,"ERROR: new type in module %.*s named %s unsupported",
                       (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - (int)pcVar29),pcVar29,
                       pcVar11 + pEVar28->offsetToName);
          }
          local_338 = (TypeClass *)0x0;
          pTVar18 = CheckPreviousTypeDefinition(ctx,source,moduleCtx,pcVar11,pEVar28,&local_338);
          if (pTVar18 != (TypeBase *)0x0) {
            if ((moduleCtx->types).count <= uVar32) goto LAB_0018947d;
            this->data[uVar32] = pTVar18;
            local_370 = local_370 + pEVar28->constantCount;
          }
          if (pTVar18 == (TypeBase *)0x0) {
            pcVar29 = pcVar11 + pEVar28->offsetToName;
            local_348.begin = pcVar29;
            sVar21 = strlen(pcVar29);
            local_348.end = pcVar29 + sVar21;
            uVar26 = (ctx->namespaces).count;
            if (uVar26 == 0) {
              nameSpace = (NamespaceData *)0x0;
            }
            else {
              lVar27 = 0;
              do {
                nameSpace = (ctx->namespaces).data[lVar27];
                if (nameSpace->fullNameHash == pEVar28->namespaceHash) goto LAB_00188270;
                lVar27 = lVar27 + 1;
              } while (uVar26 != (uint)lVar27);
              nameSpace = (NamespaceData *)0x0;
            }
LAB_00188270:
            if (nameSpace != (NamespaceData *)0x0) {
              ExpressionContext::PushScope(ctx,nameSpace);
            }
            local_308.head = (TypeHandle *)0x0;
            local_308.tail = (TypeHandle *)0x0;
            local_278.head = (MatchData *)0x0;
            local_278.tail = (MatchData *)0x0;
            local_328 = nameSpace;
            if (code->typedefCount == 0) {
              bVar6 = 0;
            }
            else {
              uVar23 = 0;
              bVar6 = 0;
              do {
                if (uVar32 == local_318[uVar23].parentType) {
                  uVar26 = 0;
                  for (pTVar16 = local_308.head; pTVar16 != (TypeHandle *)0x0;
                      pTVar16 = pTVar16->next) {
                    uVar26 = uVar26 + 1;
                  }
                  if (uVar26 < pEVar28->genericTypeCount) {
                    pEVar31 = local_318 + uVar23;
                    pcVar29 = pcVar11 + pEVar31->offsetToName;
                    sVar21 = strlen(pcVar29);
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                    pSVar15 = (SynIdentifier *)CONCAT44(extraout_var,iVar8);
                    (pSVar15->super_SynBase).typeID = 4;
                    (pSVar15->super_SynBase).begin = (Lexeme *)0x0;
                    (pSVar15->super_SynBase).end = (Lexeme *)0x0;
                    (pSVar15->super_SynBase).pos.begin = (char *)0x0;
                    (pSVar15->super_SynBase).pos.end = (char *)0x0;
                    *(undefined8 *)((long)&(pSVar15->super_SynBase).pos.end + 2) = 0;
                    *(undefined8 *)((long)&(pSVar15->super_SynBase).next + 2) = 0;
                    (pSVar15->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
                    (pSVar15->name).begin = pcVar29;
                    (pSVar15->name).end = pcVar29 + sVar21;
                    pTVar18 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar31->targetType);
                    pEVar12 = local_320;
                    if (pTVar18 == (TypeBase *)0x0) {
                      iVar8 = (int)((*ppMVar1)->name).begin;
                      anon_unknown.dwarf_c6b42::Stop
                                (ctx,source,
                                 "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                                 ,(ulong)(uint)((int)local_348.end - (int)local_348.begin),
                                 local_348.begin,pcVar11 + pEVar31->offsetToName,
                                 *(int *)&((*ppMVar1)->name).end - iVar8,iVar8);
                    }
                    bVar6 = bVar6 | pTVar18->isGeneric;
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                    pTVar16 = (TypeHandle *)CONCAT44(extraout_var_00,iVar8);
                    pTVar16->type = pTVar18;
                    pTVar16->next = (TypeHandle *)0x0;
                    pTVar16->listed = false;
                    IntrusiveList<TypeHandle>::push_back(&local_308,pTVar16);
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                    pMVar17 = (MatchData *)CONCAT44(extraout_var_01,iVar8);
                    pMVar17->name = pSVar15;
                    pMVar17->type = pTVar18;
                    pMVar17->next = (MatchData *)0x0;
                    pMVar17->listed = false;
                    IntrusiveList<MatchData>::push_back(&local_278,pMVar17);
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 < code->typedefCount);
            }
            if (pEVar28->baseType == 0) {
              baseClass = (TypeClass *)0x0;
            }
            else {
              baseClass = (TypeClass *)
                          GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar28->baseType);
              if ((baseClass == (TypeClass *)0x0) ||
                 ((baseClass->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                baseClass = (TypeClass *)0x0;
              }
              if (baseClass == (TypeClass *)0x0) {
                iVar8 = (int)((*ppMVar1)->name).begin;
                anon_unknown.dwarf_c6b42::Stop
                          (ctx,source,"ERROR: can\'t find type \'%.*s\' base type in module %.*s",
                           (ulong)(uint)((int)local_348.end - (int)local_348.begin),local_348.begin,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
              }
            }
            if (pMVar2->lexStreamSize <= pEVar28->definitionLocationStart) {
              __assert_fail("type.definitionLocationStart < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30ef,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            if (pMVar2->lexStreamSize <= pEVar28->definitionLocationEnd) {
              __assert_fail("type.definitionLocationEnd < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30f0,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            this_01 = source;
            if (pEVar28->definitionLocationEnd != 0 || pEVar28->definitionLocationStart != 0) {
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              this_01 = (SynBase *)CONCAT44(extraout_var_02,iVar8);
              SynBase::SynBase(this_01,1,pMVar2->lexStream + pEVar28->definitionLocationStart,
                               pMVar2->lexStream + pEVar28->definitionLocationEnd);
              this_01->_vptr_SynBase = (_func_int **)&PTR__SynBase_00249420;
            }
            if (pMVar2->lexStreamSize <= pEVar28->definitionLocationName) {
              __assert_fail("type.definitionLocationName < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30f4,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            if (pEVar28->definitionLocationName == 0) {
              uStack_2c8 = (char *)0x0;
              local_2c0 = 0;
              uStack_2be = 0;
              uStack_2d0 = (ModuleData *)0x0;
            }
            else {
              local_2d8 = (ModuleData *)(pMVar2->lexStream + pEVar28->definitionLocationName);
              local_2e8 = (undefined1  [8])&PTR__SynBase_002470e8;
              pMStack_2e0 = (MatchData *)CONCAT44(pMStack_2e0._4_4_,4);
              if (pMVar2->lexStream == (Lexeme *)0x0) {
                pcVar29 = (char *)0x0;
                pcVar30 = (char *)0x0;
              }
              else {
                pcVar29 = (local_2d8->name).begin;
                pcVar30 = (local_2d8->name).begin + *(uint *)&(local_2d8->name).end;
              }
              uStack_2d0 = local_2d8;
              if (pcVar30 < pcVar29) {
                __assert_fail("strEnd >= strBegin",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                              ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
              }
              local_2c0 = SUB82(pcVar30,0);
              uStack_2be = (undefined6)((ulong)pcVar30 >> 0x10);
              uStack_2c8 = pcVar29;
            }
            pcStack_2a0 = local_348.end;
            local_2a8 = local_348.begin;
            local_2b0._0_1_ = false;
            local_2b0._1_1_ = false;
            uStack_2b6 = 0;
            uStack_2b8 = 0;
            pMStack_2e0 = (MatchData *)CONCAT44(pMStack_2e0._4_4_,4);
            local_2e8 = (undefined1  [8])&PTR__SynBase_002470a0;
            local_2d8 = uStack_2d0;
            if ((int)pEVar28->definitionOffset < -1) {
              if (local_338 != (TypeClass *)0x0) {
                __assert_fail("!forwardDeclaration",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x30fe,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              proto = (TypeGenericClassProto *)
                      GetImportedModuleTypeAt
                                (ctx,source,moduleCtx,pEVar28->definitionOffset & 0x7fffffff);
              if (proto == (TypeGenericClassProto *)0x0) {
                anon_unknown.dwarf_c6b42::Stop
                          (ctx,source,"ERROR: can\'t find proto type for \'%s\' in module %.*s",
                           pcVar11 + pEVar28->offsetToName,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end -
                                        (int)((*ppMVar1)->name).begin));
              }
              if ((proto->super_TypeBase).typeID != 0x16) {
                anon_unknown.dwarf_c6b42::Stop
                          (ctx,source,
                           "ERROR: can\'t find correct proto type for \'%s\' in module %.*s",
                           pcVar11 + pEVar28->offsetToName,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end -
                                        (int)((*ppMVar1)->name).begin));
              }
              if ((bVar6 & 1) == 0) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
                this_03 = (TypeClass *)CONCAT44(extraout_var_05,iVar8);
                generics_00.tail._0_4_ = (int)local_278.tail;
                generics_00.head = local_278.head;
                generics_00.tail._4_4_ = (int)((ulong)local_278.tail >> 0x20);
                TypeClass::TypeClass
                          (this_03,ctx->allocator,(SynIdentifier *)local_2e8,this_01,ctx->scope,
                           proto,generics_00,(bool)((pEVar28->typeFlags & 4) >> 2),baseClass);
                bVar6 = pEVar28->typeFlags;
                if ((bVar6 & 0x10) != 0) {
                  this_03->completed = true;
                }
                if ((bVar6 & 8) != 0) {
                  this_03->isInternal = true;
                  local_290.typeName.begin = local_348.begin;
                  local_290.typeName.end = local_348.end;
                  local_310 = this_03;
                  local_290.importModule = pMVar2;
                  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                            (this_00,&local_290,(TypeBase **)&local_310);
                }
                ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                uVar26 = 0;
                for (pTVar16 = local_308.head; pTVar16 != (TypeHandle *)0x0; pTVar16 = pTVar16->next
                    ) {
                  uVar26 = uVar26 + 1;
                }
                if (pEVar28->genericTypeCount != uVar26) {
                  __assert_fail("type.genericTypeCount == generics.size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x3122,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                if (local_308.head != (TypeHandle *)0x0) {
                  uVar26 = NULLC::GetStringHash(local_348.begin,local_348.end);
                  HashMap<TypeClass_*>::insert(local_330,uVar26,this_03);
                }
              }
              else {
                generics_01.tail = local_308.tail;
                generics_01.head = local_308.head;
                this_03 = (TypeClass *)
                          ExpressionContext::GetGenericClassType(ctx,source,proto,generics_01);
              }
            }
            else {
              uVar26 = pEVar28->definitionOffsetStart;
              if ((ulong)uVar26 == 0xffffffff) {
                if (pEVar28->type == TYPE_COMPLEX) {
                  if (local_338 == (TypeClass *)0x0) {
                    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
                    this_03 = (TypeClass *)CONCAT44(extraout_var_07,iVar8);
                    local_258 = 0;
                    uStack_250 = 0;
                    TypeClass::TypeClass
                              (this_03,ctx->allocator,(SynIdentifier *)local_2e8,this_01,ctx->scope,
                               (TypeGenericClassProto *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),
                               (bool)((pEVar28->typeFlags & 4) >> 2),baseClass);
                  }
                  else {
                    local_338->source = this_01;
                    (local_338->identifier).super_SynBase.listed = false;
                    (local_338->identifier).super_SynBase.isInternal = false;
                    (local_338->identifier).super_SynBase.pos.end =
                         (char *)CONCAT62(uStack_2be,local_2c0);
                    (local_338->identifier).super_SynBase.next = (SynBase *)0x0;
                    *(undefined4 *)&(local_338->identifier).super_SynBase.end =
                         (undefined4)uStack_2d0;
                    *(undefined4 *)((long)&(local_338->identifier).super_SynBase.end + 4) =
                         uStack_2d0._4_4_;
                    *(undefined4 *)&(local_338->identifier).super_SynBase.pos.begin =
                         (undefined4)uStack_2c8;
                    *(undefined4 *)((long)&(local_338->identifier).super_SynBase.pos.begin + 4) =
                         uStack_2c8._4_4_;
                    *(MatchData **)&(local_338->identifier).super_SynBase.typeID = pMStack_2e0;
                    (local_338->identifier).super_SynBase.begin = (Lexeme *)uStack_2d0;
                    (local_338->identifier).name.begin = local_348.begin;
                    (local_338->identifier).name.end = local_348.end;
                    local_338->scope = ctx->scope;
                    local_338->extendable = (bool)(pEVar28->typeFlags >> 2 & 1);
                    local_338->baseClass = baseClass;
                    this_03 = local_338;
                  }
                  bVar6 = pEVar28->typeFlags;
                  if ((bVar6 & 0x10) != 0) {
                    this_03->completed = true;
                  }
                  if ((bVar6 & 8) != 0) {
                    this_03->isInternal = true;
                    local_290.typeName.begin = local_348.begin;
                    local_290.typeName.end = local_348.end;
                    local_310 = this_03;
                    local_290.importModule = pMVar2;
                    SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                              (this_00,&local_290,(TypeBase **)&local_310);
                  }
                  if (local_338 == (TypeClass *)0x0) {
                    ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                  }
                }
                else {
                  if (local_338 != (TypeClass *)0x0) {
                    __assert_fail("!forwardDeclaration",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x3144,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xe8);
                  this_03 = (TypeClass *)CONCAT44(extraout_var_06,iVar8);
                  TypeEnum::TypeEnum((TypeEnum *)this_03,(SynIdentifier *)local_2e8,this_01,
                                     ctx->scope);
                  ExpressionContext::AddType(ctx,(TypeBase *)this_03);
                  if (local_308.head != (TypeHandle *)0x0) {
                    __assert_fail("generics.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x314c,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                }
              }
              else {
                if (local_338 != (TypeClass *)0x0) {
                  __assert_fail("!forwardDeclaration",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x312a,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                if (pMVar2->lexStreamSize <= uVar26) {
                  __assert_fail("type.definitionOffsetStart < importModule->lexStreamSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x312c,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                pLVar3 = pMVar2->lexStream;
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x1640);
                this_02 = (ParseContext *)CONCAT44(extraout_var_03,iVar8);
                ParseContext::ParseContext
                          (this_02,ctx->allocator,ctx->optimizationLevel,
                           (ArrayView<InplaceStr>)ZEXT816(0));
                this_02->currentLexeme = pLVar3 + uVar26;
                ImportModuleNamespaces(this_02,pLVar3 + uVar26,pMVar2->bytecode);
                definition = (SynClassDefinition *)ParseClassDefinition(this_02);
                if ((definition == (SynClassDefinition *)0x0) ||
                   ((definition->super_SynBase).typeID != 0x3f)) {
                  definition = (SynClassDefinition *)0x0;
                }
                if (definition == (SynClassDefinition *)0x0) {
                  anon_unknown.dwarf_c6b42::Stop
                            (ctx,source,"ERROR: failed to import generic class body");
                }
                (definition->super_SynBase).field_0x3a = 1;
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
                this_03 = (TypeClass *)CONCAT44(extraout_var_04,iVar8);
                TypeGenericClassProto::TypeGenericClassProto
                          ((TypeGenericClassProto *)this_03,(SynIdentifier *)local_2e8,this_01,
                           ctx->scope,definition);
                ExpressionContext::AddType(ctx,(TypeBase *)this_03);
              }
            }
            if ((moduleCtx->types).count <= uVar32) goto LAB_0018947d;
            this->data[uVar32] = (TypeBase *)this_03;
            ppTVar14 = this->data;
            ppTVar14[uVar32]->importModule = pMVar2;
            bVar7 = InplaceStr::operator==(&ppTVar14[uVar32]->name,&local_348);
            if (!bVar7) {
              __assert_fail("moduleCtx.types[i]->name == typeName",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x3177,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            (this_03->super_TypeStruct).super_TypeBase.alignment = (uint)pEVar28->defaultAlign;
            (this_03->super_TypeStruct).super_TypeBase.size = (ulong)pEVar28->size;
            (this_03->super_TypeStruct).super_TypeBase.hasPointers = pEVar28->pointerCount != 0;
            if (((this_03 != (TypeClass *)0x0) &&
                (uVar26 = (this_03->super_TypeStruct).super_TypeBase.typeID, uVar26 < 0x1a)) &&
               ((0x3130000U >> (uVar26 & 0x1f) & 1) != 0)) {
              if (local_248.count == local_248.max) {
                SmallArray<DelayedType,_32U>::grow(&local_248,local_248.count);
              }
              if (local_248.data == (DelayedType *)0x0) {
                __assert_fail("data",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x162,
                              "void SmallArray<DelayedType, 32>::push_back(const T &) [T = DelayedType, N = 32]"
                             );
              }
              uVar23 = local_248._8_8_ & 0xffffffff;
              local_248.count = local_248.count + 1;
              local_248.data[uVar23].index = (uint)uVar32;
              local_248.data[uVar23].constants = local_370;
              local_370 = local_370 + pEVar28->constantCount;
            }
            if ((this_03 == (TypeClass *)0x0) ||
               ((this_03->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
              this_03 = (TypeClass *)0x0;
            }
            if (this_03 != (TypeClass *)0x0) {
              this_03->hasFinalizer = (bool)(pEVar28->typeFlags & 1);
            }
            if (local_328 != (NamespaceData *)0x0) {
              ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE,true);
            }
          }
        }
      }
      else {
        __s = (TypeRef *)(pcVar11 + pEVar28->offsetToName);
        sVar21 = strlen((char *)__s);
        pMStack_2e0 = (MatchData *)((long)&(__s->super_TypeBase)._vptr_TypeBase + sVar21);
        local_2e8 = (undefined1  [8])__s;
        local_2d8 = pMVar2;
        ppTVar14 = SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
                             (this_00,(TypeModulePair *)local_2e8);
        if (ppTVar14 != (TypeBase **)0x0) {
          if (uVar32 < (moduleCtx->types).count) {
            this->data[uVar32] = *ppTVar14;
            local_370 = local_370 + pEVar28->constantCount;
            goto LAB_0018816e;
          }
LAB_0018947d:
          pcVar11 = 
          "T &SmallArray<TypeBase *, 32>::operator[](unsigned int) [T = TypeBase *, N = 32]";
LAB_00189492:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,pcVar11);
        }
LAB_0018816e:
        if (ppTVar14 == (TypeBase **)0x0) goto LAB_00188180;
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < code->typeCount);
  }
  if (local_248.count != 0) {
    uVar32 = 0;
    do {
      pDVar5 = local_248.data;
      uVar26 = local_248.data[uVar32].index;
      if (pEVar12[uVar26].subCat == CAT_CLASS) {
        pEVar28 = pEVar12 + uVar26;
        local_328 = (NamespaceData *)(pcVar11 + pEVar28->offsetToName);
        local_330 = (HashMap<TypeClass_*> *)strlen((char *)local_328);
        pTVar18 = GetImportedModuleTypeAt(ctx,source,moduleCtx,uVar26);
        if (((pTVar18 == (TypeBase *)0x0) || (0x19 < pTVar18->typeID)) ||
           (pTVar25 = pTVar18, (0x3130000U >> (pTVar18->typeID & 0x1f) & 1) == 0)) {
          pTVar25 = (TypeBase *)0x0;
        }
        if (pTVar25 != (TypeBase *)0x0) {
          ExpressionContext::PushScope(ctx,pTVar18);
          pTVar25[1]._vptr_TypeBase = (_func_int **)ctx->scope;
          if ((pTVar25->typeID == 0x18) && (*(char *)&pTVar25[2].arrayTypes.tail == '\x01')) {
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
            allocator = ctx->allocator;
            scope = ctx->scope;
            pTVar22 = ctx->typeTypeID;
            iVar9 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
            puVar19 = (undefined8 *)CONCAT44(extraout_var_09,iVar9);
            *(undefined4 *)(puVar19 + 1) = 4;
            puVar19[2] = 0;
            puVar19[3] = 0;
            puVar19[4] = 0;
            puVar19[5] = 0;
            *(undefined8 *)((long)puVar19 + 0x2a) = 0;
            *(undefined8 *)((long)puVar19 + 0x32) = 0;
            *puVar19 = &PTR__SynBase_002470a0;
            puVar19[8] = "$typeid";
            puVar19[9] = "";
            uVar26 = ctx->uniqueVariableId;
            ctx->uniqueVariableId = uVar26 + 1;
            VariableData::VariableData
                      ((VariableData *)CONCAT44(extraout_var_08,iVar8),allocator,source,scope,0,
                       pTVar22,(SynIdentifier *)CONCAT44(extraout_var_09,iVar9),0,uVar26);
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
            pMVar20 = (MemberHandle *)CONCAT44(extraout_var_10,iVar9);
            pMVar20->source = source;
            pMVar20->variable = (VariableData *)CONCAT44(extraout_var_08,iVar8);
            pMVar20->initializer = (SynBase *)0x0;
            pMVar20->next = (MemberHandle *)0x0;
            pMVar20->listed = false;
            IntrusiveList<MemberHandle>::push_back
                      ((IntrusiveList<MemberHandle> *)&pTVar25[1].typeID,pMVar20);
          }
          pcVar29 = (char *)((long)(local_330->freeList).little +
                            (long)(&local_328->children + -2) + 1);
          if ((pEVar28->field_8).arrSize != 0) {
            uVar26 = 0;
            do {
              sVar21 = strlen(pcVar29);
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
              puVar19 = (undefined8 *)CONCAT44(extraout_var_11,iVar8);
              *(undefined4 *)(puVar19 + 1) = 4;
              puVar19[2] = 0;
              puVar19[3] = 0;
              puVar19[4] = 0;
              puVar19[5] = 0;
              *(undefined8 *)((long)puVar19 + 0x2a) = 0;
              *(undefined8 *)((long)puVar19 + 0x32) = 0;
              *puVar19 = &PTR__SynBase_002470a0;
              puVar19[8] = pcVar29;
              puVar19[9] = pcVar29 + sVar21;
              uVar10 = (pEVar28->field_11).subType + uVar26;
              pTVar22 = GetImportedModuleTypeAt(ctx,source,moduleCtx,local_2f0[uVar10].type);
              if (pTVar22 == (TypeBase *)0x0) {
                iVar8 = (int)((*ppMVar1)->name).begin;
                anon_unknown.dwarf_c6b42::Stop
                          (ctx,source,"ERROR: can\'t find member %d type for \'%s\' in module %.*s",
                           (ulong)(uVar26 + 1),pcVar11 + pEVar28->offsetToName,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
              }
              iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
              alignment = local_2f0[uVar10].alignment;
              uVar10 = local_2f0[uVar10].offset;
              uniqueId = ctx->uniqueVariableId;
              ctx->uniqueVariableId = uniqueId + 1;
              VariableData::VariableData
                        ((VariableData *)CONCAT44(extraout_var_12,iVar9),ctx->allocator,source,
                         ctx->scope,alignment,pTVar22,
                         (SynIdentifier *)CONCAT44(extraout_var_11,iVar8),uVar10,uniqueId);
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
              pMVar20 = (MemberHandle *)CONCAT44(extraout_var_13,iVar8);
              pMVar20->source = source;
              pMVar20->variable = (VariableData *)CONCAT44(extraout_var_12,iVar9);
              pMVar20->initializer = (SynBase *)0x0;
              pMVar20->next = (MemberHandle *)0x0;
              pMVar20->listed = false;
              IntrusiveList<MemberHandle>::push_back
                        ((IntrusiveList<MemberHandle> *)&pTVar25[1].typeID,pMVar20);
              uVar26 = uVar26 + 1;
              pcVar29 = pcVar29 + sVar21 + 1;
            } while (uVar26 < (pEVar28->field_8).arrSize);
          }
          if (pEVar28->constantCount != 0) {
            plVar33 = &(pDVar5[uVar32].constants)->value;
            uVar23 = 1;
            do {
              sVar21 = strlen(pcVar29);
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
              pSVar15 = (SynIdentifier *)CONCAT44(extraout_var_14,iVar8);
              (pSVar15->super_SynBase).typeID = 4;
              (pSVar15->super_SynBase).begin = (Lexeme *)0x0;
              (pSVar15->super_SynBase).end = (Lexeme *)0x0;
              (pSVar15->super_SynBase).pos.begin = (char *)0x0;
              (pSVar15->super_SynBase).pos.end = (char *)0x0;
              *(undefined8 *)((long)&(pSVar15->super_SynBase).pos.end + 2) = 0;
              *(undefined8 *)((long)&(pSVar15->super_SynBase).next + 2) = 0;
              (pSVar15->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
              (pSVar15->name).begin = pcVar29;
              (pSVar15->name).end = pcVar29 + sVar21;
              pTVar22 = GetImportedModuleTypeAt
                                  (ctx,source,moduleCtx,
                                   ((ExternConstantInfo *)((long)plVar33 + -4))->type);
              if (pTVar22 == (TypeBase *)0x0) {
                iVar8 = (int)((*ppMVar1)->name).begin;
                anon_unknown.dwarf_c6b42::Stop
                          (ctx,source,
                           "ERROR: can\'t find constant %d type for \'%s\' in module %.*s",uVar23,
                           pcVar11 + pEVar28->offsetToName,
                           (ulong)(uint)(*(int *)&((*ppMVar1)->name).end - iVar8),iVar8);
              }
              if (pTVar22 == ctx->typeBool) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                pEVar24 = (ExprBase *)CONCAT44(extraout_var_16,iVar8);
                lVar27 = *plVar33;
                pEVar24->typeID = 3;
                pEVar24->source = source;
                pEVar24->type = pTVar22;
                pEVar24->next = (ExprBase *)0x0;
                pEVar24->listed = false;
                pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
                pEVar24->field_0x29 = lVar27 != 0;
              }
              else if (((((ctx->typeChar == pTVar22) || (ctx->typeShort == pTVar22)) ||
                        (ctx->typeInt == pTVar22)) || (ctx->typeLong == pTVar22)) ||
                      ((pTVar22 != (TypeBase *)0x0 && (pTVar22->typeID == 0x19)))) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar24 = (ExprBase *)CONCAT44(extraout_var_15,iVar8);
                pp_Var4 = (_func_int **)*plVar33;
                pEVar24->typeID = 6;
                pEVar24->source = source;
                pEVar24->type = pTVar22;
                pEVar24->next = (ExprBase *)0x0;
                pEVar24->listed = false;
                pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
                pEVar24[1]._vptr_ExprBase = pp_Var4;
              }
              else if ((ctx->typeFloat == pTVar22) || (ctx->typeDouble == pTVar22)) {
                pp_Var4 = (_func_int **)*plVar33;
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                pEVar24 = (ExprBase *)CONCAT44(extraout_var_17,iVar8);
                pEVar24->typeID = 7;
                pEVar24->source = source;
                pEVar24->type = pTVar22;
                pEVar24->next = (ExprBase *)0x0;
                pEVar24->listed = false;
                pEVar24->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248538;
                pEVar24[1]._vptr_ExprBase = pp_Var4;
              }
              else {
                pEVar24 = (ExprBase *)0x0;
              }
              if (pEVar24 == (ExprBase *)0x0) {
                anon_unknown.dwarf_c6b42::Stop
                          (ctx,source,"ERROR: can\'t import constant %d of type \'%.*s\'",uVar23,
                           (ulong)(uint)(*(int *)&(pTVar22->name).end - (int)(pTVar22->name).begin))
                ;
              }
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              node = (ConstantData *)CONCAT44(extraout_var_18,iVar8);
              pcVar29 = pcVar29 + sVar21 + 1;
              node->name = pSVar15;
              node->value = pEVar24;
              node->next = (ConstantData *)0x0;
              node->listed = false;
              IntrusiveList<ConstantData>::push_back
                        ((IntrusiveList<ConstantData> *)&pTVar25[1].name.end,node);
              uVar26 = (uint)uVar23;
              uVar23 = (ulong)(uVar26 + 1);
              plVar33 = (longlong *)((long)plVar33 + 0xc);
            } while (uVar26 < pEVar28->constantCount);
          }
          ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
          pEVar12 = local_320;
        }
        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x18)) {
          pTVar18 = (TypeBase *)0x0;
        }
        if (pTVar18 != (TypeBase *)0x0) {
          local_2e8 = (undefined1  [8])0x0;
          pMStack_2e0 = (MatchData *)0x0;
          if (code->typedefCount != 0) {
            uVar23 = 0;
            uVar26 = 0;
            pEVar31 = local_318;
            do {
              if (pEVar31->parentType == pDVar5[uVar32].index) {
                pcVar29 = pcVar11 + pEVar31->offsetToName;
                sVar21 = strlen(pcVar29);
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
                pSVar15 = (SynIdentifier *)CONCAT44(extraout_var_19,iVar8);
                (pSVar15->super_SynBase).typeID = 4;
                (pSVar15->super_SynBase).begin = (Lexeme *)0x0;
                (pSVar15->super_SynBase).end = (Lexeme *)0x0;
                (pSVar15->super_SynBase).pos.begin = (char *)0x0;
                (pSVar15->super_SynBase).pos.end = (char *)0x0;
                *(undefined8 *)((long)&(pSVar15->super_SynBase).pos.end + 2) = 0;
                *(undefined8 *)((long)&(pSVar15->super_SynBase).next + 2) = 0;
                (pSVar15->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
                (pSVar15->name).begin = pcVar29;
                (pSVar15->name).end = pcVar29 + sVar21;
                pTVar25 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar31->targetType);
                if (pTVar25 == (TypeBase *)0x0) {
                  iVar8 = (int)((*ppMVar1)->name).begin;
                  anon_unknown.dwarf_c6b42::Stop
                            (ctx,source,
                             "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                             ,local_330,local_328,pcVar11 + pEVar31->offsetToName,
                             *(int *)&((*ppMVar1)->name).end - iVar8,iVar8);
                }
                if (uVar26 < pEVar28->genericTypeCount) {
                  uVar26 = uVar26 + 1;
                }
                else {
                  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                  pMVar17 = (MatchData *)CONCAT44(extraout_var_20,iVar8);
                  pMVar17->name = pSVar15;
                  pMVar17->type = pTVar25;
                  pMVar17->next = (MatchData *)0x0;
                  pMVar17->listed = false;
                  IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)local_2e8,pMVar17)
                  ;
                }
              }
              uVar23 = uVar23 + 1;
              pEVar31 = pEVar31 + 1;
            } while (uVar23 < code->typedefCount);
          }
          pTVar18[2].refType = (TypeRef *)local_2e8;
          pTVar18[2].arrayTypes.head = (TypeHandle *)pMStack_2e0;
          pEVar12 = local_320;
        }
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < (local_248._8_8_ & 0xffffffff));
  }
  SmallArray<DelayedType,_32U>::~SmallArray(&local_248);
  NULLC::TraceScope::~TraceScope(&local_268);
  return;
}

Assistant:

void ImportModuleTypes(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypes");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import types
	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);
	ExternConstantInfo *constantList = FindFirstConstant(bCode);
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	unsigned prevSize = moduleCtx.types.size();

	moduleCtx.types.resize(bCode->typeCount);

	memset(moduleCtx.types.data + prevSize, 0, (moduleCtx.types.size() - prevSize) * sizeof(moduleCtx.types.data[0]));

	SmallArray<DelayedType, 32> delayedTypes(ctx.allocator);

	ExternConstantInfo *currentConstant = constantList;

	for(unsigned i = 0; i < bCode->typeCount; i++)
	{
		ExternTypeInfo &type = typeList[i];

		ModuleData *importModule = moduleCtx.data;

		if(type.definitionModule != 0)
			importModule = moduleCtx.dependencies[type.definitionModule - 1];

		// Skip internal types if we already imported that module
		if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
		{
			InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

			if(TypeBase **prev = ctx.internalTypeMap.find(TypeModulePair(typeName, importModule)))
			{
				moduleCtx.types[i] = *prev;

				currentConstant += type.constantCount;
				continue;
			}
		}

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
		case ExternTypeInfo::CAT_ARRAY:
		case ExternTypeInfo::CAT_POINTER:
		case ExternTypeInfo::CAT_FUNCTION:
			break;
		case ExternTypeInfo::CAT_CLASS:
			{
				TypeClass *forwardDeclaration = NULL;

				// Skip existing types
				if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, &forwardDeclaration))
				{
					moduleCtx.types[i] = prevType;

					currentConstant += type.constantCount;
					break;
				}

				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				NamespaceData *parentNamespace = NULL;

				for(unsigned k = 0; k < ctx.namespaces.size(); k++)
				{
					if(ctx.namespaces[k]->fullNameHash == type.namespaceHash)
					{
						parentNamespace = ctx.namespaces[k];
						break;
					}
				}

				if(parentNamespace)
					ctx.PushScope(parentNamespace);

				// Find all generics for this type
				bool isGeneric = false;

				IntrusiveList<TypeHandle> generics;
				IntrusiveList<MatchData> actualGenerics;

				for(unsigned k = 0; k < bCode->typedefCount; k++)
				{
					ExternTypedefInfo &alias = aliasList[k];

					if(alias.parentType == i && generics.size() < type.genericTypeCount)
					{
						InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

						SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

						TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

						if(!targetType)
							Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

						isGeneric |= targetType->isGeneric;

						generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(targetType));
						actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
					}
				}

				TypeClass *baseType = NULL;

				if(type.baseType)
				{
					baseType = getType<TypeClass>(GetImportedModuleTypeAt(ctx, source, moduleCtx, type.baseType));

					if(!baseType)
						Stop(ctx, source, "ERROR: can't find type '%.*s' base type in module %.*s", FMT_ISTR(typeName), FMT_ISTR(moduleCtx.data->name));
				}

				assert(type.definitionLocationStart < importModule->lexStreamSize);
				assert(type.definitionLocationEnd < importModule->lexStreamSize);
				
				SynBase *locationSource = type.definitionLocationStart != 0 || type.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(type.definitionLocationStart + importModule->lexStream, type.definitionLocationEnd + importModule->lexStream) : source;

				assert(type.definitionLocationName < importModule->lexStreamSize);

				Lexeme *locationName = type.definitionLocationName + importModule->lexStream;

				SynIdentifier identifier = type.definitionLocationName != 0 ? SynIdentifier(locationName, locationName, typeName) : SynIdentifier(typeName);

				TypeBase *importedType = NULL;

				if(type.definitionOffset != ~0u && type.definitionOffset & 0x80000000)
				{
					assert(!forwardDeclaration);

					TypeBase *proto = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.definitionOffset & ~0x80000000);

					if(!proto)
						Stop(ctx, source, "ERROR: can't find proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					TypeGenericClassProto *protoClass = getType<TypeGenericClassProto>(proto);

					if(!protoClass)
						Stop(ctx, source, "ERROR: can't find correct proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					if(isGeneric)
					{
						importedType = ctx.GetGenericClassType(source, protoClass, generics);

						// TODO: assert that alias list is empty and that correct number of generics was exported
					}
					else
					{
						TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, protoClass, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
							classType->completed = true;

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
						{
							classType->isInternal = true;

							ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
						}

						importedType = classType;

						ctx.AddType(importedType);

						assert(type.genericTypeCount == generics.size());

						if(!generics.empty())
							ctx.genericTypeMap.insert(typeName.hash(), classType);
					}
				}
				else if(type.definitionOffsetStart != ~0u)
				{
					assert(!forwardDeclaration);

					assert(type.definitionOffsetStart < importModule->lexStreamSize);
					Lexeme *start = type.definitionOffsetStart + importModule->lexStream;

					ParseContext *parser = new (ctx.get<ParseContext>()) ParseContext(ctx.allocator, ctx.optimizationLevel, ArrayView<InplaceStr>());

					parser->currentLexeme = start;

					ImportModuleNamespaces(*parser, start, importModule->bytecode);

					SynClassDefinition *definition = getType<SynClassDefinition>(ParseClassDefinition(*parser));

					if(!definition)
						Stop(ctx, source, "ERROR: failed to import generic class body");

					definition->imported = true;

					importedType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(identifier, locationSource, ctx.scope, definition);

					ctx.AddType(importedType);

					// TODO: check that type doesn't have generics or aliases
				}
				else if(type.type != ExternTypeInfo::TYPE_COMPLEX)
				{
					assert(!forwardDeclaration);

					TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(identifier, locationSource, ctx.scope);

					importedType = enumType;

					ctx.AddType(importedType);

					assert(generics.empty());
				}
				else
				{
					IntrusiveList<MatchData> actualGenerics;

					TypeClass *classType = NULL;

					if(forwardDeclaration)
					{
						classType = forwardDeclaration;

						classType->source = locationSource;
						classType->identifier = identifier;
						classType->scope = ctx.scope;
						classType->extendable = (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0;
						classType->baseClass = baseType;
					}
					else
					{
						classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, NULL, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);
					}

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
						classType->completed = true;

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
					{
						classType->isInternal = true;

						ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
					}

					importedType = classType;

					if(!forwardDeclaration)
						ctx.AddType(importedType);
				}

				moduleCtx.types[i] = importedType;

				moduleCtx.types[i]->importModule = importModule;

				assert(moduleCtx.types[i]->name == typeName);

				importedType->alignment = type.defaultAlign;
				importedType->size = type.size;

				importedType->hasPointers = type.pointerCount != 0;

				if(getType<TypeStruct>(importedType))
				{
					delayedTypes.push_back(DelayedType(i, currentConstant));

					currentConstant += type.constantCount;
				}

				if(TypeClass *classType = getType<TypeClass>(importedType))
					classType->hasFinalizer = type.typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER;

				if(parentNamespace)
					ctx.PopScope(SCOPE_NAMESPACE);
			}
			break;
		default:
			Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
		}
	}

	for(unsigned i = 0; i < delayedTypes.size(); i++)
	{
		DelayedType &delayedType = delayedTypes[i];
		ExternTypeInfo &type = typeList[delayedType.index];

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_CLASS:
			{
				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				TypeBase *importedType = GetImportedModuleTypeAt(ctx, source, moduleCtx, delayedType.index);

				const char *memberNames = typeName.end + 1;

				if(TypeStruct *structType = getType<TypeStruct>(importedType))
				{
					ctx.PushScope(importedType);

					structType->typeScope = ctx.scope;

					if(TypeClass *typeClass = getType<TypeClass>(structType))
					{
						if(typeClass->extendable)
						{
							// TODO: apart from LLVM failure, were there any issues with this member missing?
							VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeTypeID, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid")), 0, ctx.uniqueVariableId++);

							structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
						}
					}

					for(unsigned n = 0; n < type.memberCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						ExternMemberInfo &memberInfo = memberList[type.memberOffset + n];

						TypeBase *memberType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberInfo.type);

						if(!memberType)
							Stop(ctx, source, "ERROR: can't find member %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, memberInfo.alignment, memberType, memberNameIdentifier, memberInfo.offset, ctx.uniqueVariableId++);

						structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
					}

					ExternConstantInfo *constantInfo = delayedType.constants;

					for(unsigned int n = 0; n < type.constantCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						TypeBase *constantType = GetImportedModuleTypeAt(ctx, source, moduleCtx, constantInfo->type);

						if(!constantType)
							Stop(ctx, source, "ERROR: can't find constant %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						ExprBase *value = NULL;

						if(constantType == ctx.typeBool)
						{
							value = new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, constantType, constantInfo->value != 0);
						}
						else if(ctx.IsIntegerType(constantType) || isType<TypeEnum>(constantType))
						{
							value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, constantType, constantInfo->value);
						}
						else if(ctx.IsFloatingPointType(constantType))
						{
							double data = 0.0;
							memcpy(&data, &constantInfo->value, sizeof(double));
							value = new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, constantType, data);
						}
							
						if(!value)
							Stop(ctx, source, "ERROR: can't import constant %d of type '%.*s'", n + 1, FMT_ISTR(constantType->name));

						structType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(memberNameIdentifier, value));

						constantInfo++;
					}

					ctx.PopScope(SCOPE_TYPE);
				}

				if(TypeClass *typeClass = getType<TypeClass>(importedType))
				{
					unsigned genericsFound = 0;

					IntrusiveList<MatchData> aliases;

					for(unsigned k = 0; k < bCode->typedefCount; k++)
					{
						ExternTypedefInfo &alias = aliasList[k];

						if(alias.parentType == delayedType.index)
						{
							InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

							SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

							TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

							if(!targetType)
								Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

							if(genericsFound < type.genericTypeCount)
								genericsFound++;
							else
								aliases.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
						}
					}

					typeClass->aliases = aliases;
				}
			}
			break;
		default:
			break;
		}
	}
}